

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

void gc_call_finalizer(global_State *g,lua_State *L,cTValue *mo,GCobj *o)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  GCSize GVar4;
  uint uVar5;
  cTValue *pcVar6;
  TValue *pTVar7;
  int iVar8;
  ptrdiff_t argbase;
  TValue *pTVar9;
  
  bVar2 = g->hookmask;
  GVar4 = (g->gc).threshold;
  pbVar1 = (byte *)((long)&g[1].gc.tabnum + 4);
  *pbVar1 = *pbVar1 & 0xef;
  g->hookmask = bVar2 & 0x2f | 0x50;
  if ((char)bVar2 < '\0') {
    lj_dispatch_update(g);
  }
  (g->gc).threshold = 0x7fffff00;
  pcVar6 = L->top;
  *pcVar6 = *mo;
  bVar3 = (o->gch).gct;
  pcVar6[1].u32.lo = (uint32_t)o;
  *(uint *)((long)pcVar6 + 0xc) = ~(uint)bVar3;
  L->top = pcVar6 + 2;
  iVar8 = lj_vm_pcall(L,pcVar6 + 1,1,0xffffffffffffffff);
  g->hookmask = g->hookmask & 0xf | bVar2 & 0xf0;
  if ((char)bVar2 < '\0') {
    lj_dispatch_update(g);
  }
  (g->gc).threshold = GVar4;
  if (iVar8 != 0) {
    pTVar7 = L->top;
    pTVar9 = pTVar7;
    if ((*(byte *)((ulong)(L->glref).ptr32 + 0x10b) & 0x10) != 0) {
      uVar5 = (L->stack).ptr32;
      argbase = lj_vmevent_prepare(L,LJ_VMEVENT_ERRFIN);
      pTVar9 = L->top;
      if (argbase != 0) {
        L->top = pTVar9 + 1;
        *pTVar9 = *(TValue *)((long)pTVar7 + (ulong)(L->stack).ptr32 + (-8 - (ulong)uVar5));
        lj_vmevent_call(L,argbase);
        pTVar9 = L->top;
      }
    }
    L->top = pTVar9 + -1;
  }
  return;
}

Assistant:

static void gc_call_finalizer(global_State *g, lua_State *L,
			      cTValue *mo, GCobj *o)
{
  /* Save and restore lots of state around the __gc callback. */
  uint8_t oldh = hook_save(g);
  GCSize oldt = g->gc.threshold;
  int errcode;
  TValue *top;
  lj_trace_abort(g);
  hook_entergc(g);  /* Disable hooks and new traces during __gc. */
  if (LJ_HASPROFILE && (oldh & HOOK_PROFILE)) lj_dispatch_update(g);
  g->gc.threshold = LJ_MAX_MEM;  /* Prevent GC steps. */
  top = L->top;
  copyTV(L, top++, mo);
  if (LJ_FR2) setnilV(top++);
  setgcV(L, top, o, ~o->gch.gct);
  L->top = top+1;
  errcode = lj_vm_pcall(L, top, 1+0, -1);  /* Stack: |mo|o| -> | */
  hook_restore(g, oldh);
  if (LJ_HASPROFILE && (oldh & HOOK_PROFILE)) lj_dispatch_update(g);
  g->gc.threshold = oldt;  /* Restore GC threshold. */
  if (errcode) {
    ptrdiff_t errobj = savestack(L, L->top-1);  /* Stack may be resized. */
    lj_vmevent_send(L, ERRFIN,
      copyTV(L, L->top++, restorestack(L, errobj));
    );
    L->top--;
  }
}